

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstyleditemdelegate.cpp
# Opt level: O3

QSize __thiscall
QStyledItemDelegate::sizeHint
          (QStyledItemDelegate *this,QStyleOptionViewItem *option,QModelIndex *index)

{
  QAbstractItemModel *pQVar1;
  QWidget *this_00;
  bool bVar2;
  QStyle *pQVar3;
  QSize QVar4;
  QMetaType QVar5;
  anon_union_24_3_e3d07ef4_for_data *lhs;
  anon_union_24_3_e3d07ef4_for_data *paVar6;
  long in_FS_OFFSET;
  QStyleOptionViewItem opt;
  QMetaType local_120;
  anon_union_24_3_e3d07ef4_for_data local_118 [3];
  QFont local_c0 [24];
  QLocale local_a8 [6];
  QIcon local_78;
  QArrayData *local_70;
  QBrush local_50 [8];
  anon_union_24_3_e3d07ef4_for_data local_48;
  undefined1 *puStack_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  local_48._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
  puStack_30 = &DAT_aaaaaaaaaaaaaaaa;
  local_48.shared = (PrivateShared *)&DAT_aaaaaaaaaaaaaaaa;
  local_48._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  pQVar1 = (index->m).ptr;
  if (pQVar1 == (QAbstractItemModel *)0x0) {
    local_48.shared = (PrivateShared *)0x0;
    local_48._8_8_ = (undefined1 *)0x0;
    local_48._16_8_ = (undefined1 *)0x0;
    puStack_30 = (undefined1 *)0x2;
  }
  else {
    paVar6 = &local_48;
    (**(code **)(*(long *)pQVar1 + 0x90))(paVar6,pQVar1,index,0xd);
    if ((undefined1 *)0x3 < puStack_30) {
      local_120.d_ptr = (QMetaTypeInterface *)&QtPrivate::QMetaTypeInterfaceWrapper<QSize>::metaType
      ;
      local_118[0]._0_8_ = (ulong)puStack_30 & 0xfffffffffffffffc;
      lhs = local_118;
      bVar2 = comparesEqual((QMetaType *)&lhs->shared,&local_120);
      if (bVar2) {
        if (((ulong)puStack_30 & 1) == 0) {
          lhs = &local_48;
        }
        else {
          lhs = (anon_union_24_3_e3d07ef4_for_data *)
                (local_48.shared + *(int *)(local_48.shared + 4));
        }
      }
      else {
        local_118[0]._forAlignment = (PrivateShared *)0xffffffffffffffff;
        QVar5.d_ptr = (QMetaTypeInterface *)::QVariant::metaType();
        if (((ulong)puStack_30 & 1) != 0) {
          paVar6 = (anon_union_24_3_e3d07ef4_for_data *)
                   (local_48.shared + *(int *)(local_48.shared + 4));
        }
        QMetaType::convert(QVar5,paVar6,local_120,lhs);
      }
      QVar4 = (QSize)lhs->shared;
      goto LAB_0055ea17;
    }
  }
  memset(local_118,0xaa,0xd0);
  QStyleOptionViewItem::QStyleOptionViewItem((QStyleOptionViewItem *)local_118,option);
  (**(code **)(*(long *)this + 0xb8))(this,local_118,index);
  this_00 = option->widget;
  if (this_00 == (QWidget *)0x0) {
    pQVar3 = QApplication::style();
  }
  else {
    pQVar3 = QWidget::style(this_00);
  }
  local_120.d_ptr = (QMetaTypeInterface *)0xffffffffffffffff;
  QVar4 = (QSize)(**(code **)(*(long *)pQVar3 + 0xe8))(pQVar3,0x16,local_118,&local_120,this_00);
  QBrush::~QBrush((QBrush *)(local_118[0].data + 200));
  if (local_70 != (QArrayData *)0x0) {
    LOCK();
    (local_70->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_70->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_70->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_70,2,0x10);
    }
  }
  QIcon::~QIcon((QIcon *)(local_118[0].data + 0xa0));
  QLocale::~QLocale((QLocale *)(local_118[0].data + 0x70));
  QFont::~QFont((QFont *)(local_118[0].data + 0x58));
  QStyleOption::~QStyleOption((QStyleOption *)local_118);
LAB_0055ea17:
  ::QVariant::~QVariant((QVariant *)&local_48);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return QVar4;
  }
  __stack_chk_fail();
}

Assistant:

QSize QStyledItemDelegate::sizeHint(const QStyleOptionViewItem &option,
                                   const QModelIndex &index) const
{
    QVariant value = index.data(Qt::SizeHintRole);
    if (value.isValid())
        return qvariant_cast<QSize>(value);

    QStyleOptionViewItem opt = option;
    initStyleOption(&opt, index);
    const QWidget *widget = QStyledItemDelegatePrivate::widget(option);
    QStyle *style = widget ? widget->style() : QApplication::style();
    return style->sizeFromContents(QStyle::CT_ItemViewItem, &opt, QSize(), widget);
}